

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<std::error_code> __thiscall
cinatra::coro_http_client::handle_chunked<std::__cxx11::string>
          (coro_http_client *this,resp_data *data,
          req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ctx)

{
  long lVar1;
  string_view s;
  string_view delim;
  string_view buf;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 *extraout_RAX;
  size_t sVar4;
  char *pcVar5;
  size_type sVar6;
  size_type sVar7;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  ptVar8;
  undefined8 *extraout_RAX_02;
  error_code *this_00;
  long *plVar9;
  ulong *puVar10;
  undefined8 *puVar11;
  size_type *psVar12;
  long in_RDX;
  undefined8 in_RSI;
  LazyBase<std::error_code,_false> in_RDI;
  const_buffer cVar13;
  error_code eVar14;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  coro_http_client *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  char *in_stack_fffffffffffffb58;
  int local_450;
  int local_430;
  int local_3f8;
  int local_3c4;
  basic_seq_coro_file<(coro_io::execution_type)1> *this_01;
  undefined8 *puVar15;
  char *pcVar16;
  undefined4 uStack_19c;
  
  puVar3 = (undefined8 *)operator_new(0x208,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<std::error_code>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar3 = handle_chunked<std::__cxx11::string>;
    puVar3[1] = handle_chunked<std::__cxx11::string>;
    this_00 = (error_code *)(puVar3 + 0x1b);
    plVar9 = puVar3 + 0x2f;
    this_01 = (basic_seq_coro_file<(coro_io::execution_type)1> *)(puVar3 + 0x31);
    puVar15 = puVar3 + 0x32;
    pcVar16 = (char *)(puVar3 + 0x40);
    puVar10 = puVar3 + 0x35;
    puVar11 = puVar3 + 0x36;
    psVar12 = puVar3 + 0x37;
    puVar3[0x3f] = in_RSI;
    puVar3[0x2e] = in_RDX;
    req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                in_stack_fffffffffffffb18);
    async_simple::coro::detail::LazyPromise<std::error_code>::LazyPromise
              ((LazyPromise<std::error_code> *)
               CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    async_simple::coro::detail::LazyPromise<std::error_code>::get_return_object
              ((LazyPromise<std::error_code> *)in_stack_fffffffffffffb38);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar3 + 2));
    bVar2 = std::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x205));
    if (bVar2) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x205));
      std::error_code::error_code
                ((error_code *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      *plVar9 = 0;
      while( true ) {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        delim._M_len._4_4_ = in_stack_fffffffffffffb54;
        delim._M_len._0_4_ = in_stack_fffffffffffffb50;
        delim._M_str = in_stack_fffffffffffffb58;
        async_read_until<asio::basic_streambuf<std::allocator<char>>>
                  ((coro_http_client *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)
                   ,(basic_streambuf<std::allocator<char>_> *)
                    CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),delim);
        async_simple::coro::detail::LazyPromiseBase::
        await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                  ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                   (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        bVar2 = async_simple::coro::detail::
                LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                          ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                           (puVar3 + 0x30));
        if (!bVar2) break;
        puVar3[0x2b] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                       (puVar3 + 0x30);
        async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
        awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        std::tie<std::error_code,unsigned_long>
                  ((error_code *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        ptVar8 = std::tuple<std::error_code&,unsigned_long&>::operator=
                           ((tuple<std::error_code_&,_unsigned_long_&> *)
                            CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                            (pair<std::error_code,_unsigned_long> *)
                            CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        puVar3[0x33] = ptVar8;
        async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
        ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x3e8e8a);
        async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                  ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x3e8e97);
        bVar2 = std::error_code::operator_cast_to_bool(this_00);
        if (bVar2) {
LAB_003e9764:
          async_simple::coro::detail::LazyPromise<std::error_code>::return_value<std::error_code>
                    ((LazyPromise<std::error_code> *)
                     CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                     (error_code *)in_stack_fffffffffffffb18);
          local_3f8 = 3;
LAB_003e978d:
          if (local_3f8 == 3) {
            async_simple::coro::detail::LazyPromiseBase::final_suspend
                      ((LazyPromiseBase *)(puVar3 + 2));
            bVar2 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                              ((FinalAwaiter *)((long)puVar3 + 0x206));
            if (!bVar2) {
              *puVar3 = 0;
              *(undefined1 *)((long)puVar3 + 0x204) = 4;
              handle_chunked((void *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                             (void *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              (*(code *)*extraout_RAX_02)(extraout_RAX_02);
              return (Lazy<std::error_code>)in_RDI._coro.__handle_.__handle_;
            }
            async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                      ((FinalAwaiter *)((long)puVar3 + 0x206));
            in_stack_fffffffffffffb24 = 0;
            local_3c4 = 0;
          }
          else {
            local_3c4 = local_3f8;
          }
          async_simple::coro::detail::LazyPromise<std::error_code>::~LazyPromise
                    ((LazyPromise<std::error_code> *)0x3e9902);
          req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb24,local_3c4));
          if (puVar3 == (undefined8 *)0x0) {
            return (Lazy<std::error_code>)in_RDI._coro.__handle_.__handle_;
          }
          operator_delete(puVar3,0x208);
          return (Lazy<std::error_code>)in_RDI._coro.__handle_.__handle_;
        }
        sVar4 = asio::basic_streambuf<std::allocator<char>_>::size
                          ((basic_streambuf<std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
        puVar3[0x34] = sVar4;
        *puVar10 = puVar3[0x34] - *plVar9;
        cVar13 = (const_buffer)
                 asio::basic_streambuf<std::allocator<char>_>::data
                           ((basic_streambuf<std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
        *(const_buffer *)(puVar3 + 0x1f) = cVar13;
        pcVar5 = asio::buffer_cast<char_const*>((const_buffer *)0x3e8f59);
        *puVar11 = pcVar5;
        pcVar5 = (char *)*puVar11;
        lVar1 = *plVar9;
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CRCF_abi_cxx11_);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0x21),pcVar5,
                   lVar1 - sVar6);
        s._M_len._4_4_ = in_stack_fffffffffffffb24;
        s._M_len._0_4_ = in_stack_fffffffffffffb20;
        s._M_str._0_4_ = in_stack_fffffffffffffb28;
        s._M_str._4_4_ = in_stack_fffffffffffffb2c;
        sVar7 = hex_to_int(s);
        *psVar12 = sVar7;
        asio::basic_streambuf<std::allocator<char>_>::consume
                  ((basic_streambuf<std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        if ((long)*psVar12 < 0) {
          null_logger_t::operator<<((null_logger_t *)&NULL_LOGGER,(char (*) [17])"bad chunked size")
          ;
          eVar14 = asio::error::make_error_code(0);
          *(ulong *)this_00 = CONCAT44(uStack_19c,eVar14._M_value);
          puVar3[0x1c] = eVar14._M_cat;
          local_430 = 5;
        }
        else {
          if (*puVar10 < *psVar12 + 2) {
            puVar3[0x38] = (*psVar12 - *puVar10) + 2;
            async_read<asio::basic_streambuf<std::allocator<char>>&>
                      (in_stack_fffffffffffffb38,
                       (basic_streambuf<std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                       CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
            async_simple::coro::detail::LazyPromiseBase::
            await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                      ((LazyPromiseBase *)
                       CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                       (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
            bVar2 = async_simple::coro::detail::
                    LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                              ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                               (puVar3 + 0x39));
            if (!bVar2) {
              *(undefined1 *)((long)puVar3 + 0x204) = 2;
              handle_chunked((void *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                             in_stack_fffffffffffffb38);
              (*(code *)*extraout_RAX_00)(extraout_RAX_00);
              return (Lazy<std::error_code>)in_RDI._coro.__handle_.__handle_;
            }
            puVar3[0x2c] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                           (puVar3 + 0x39);
            async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>
            ::awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                          CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
            std::tie<std::error_code,unsigned_long>
                      ((error_code *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                       (unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
            ptVar8 = std::tuple<std::error_code&,unsigned_long&>::operator=
                               ((tuple<std::error_code_&,_unsigned_long_&> *)
                                CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                (pair<std::error_code,_unsigned_long> *)
                                CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
            puVar3[0x3b] = ptVar8;
            async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
            ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x3e9303);
            async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                      ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x3e9310);
            bVar2 = std::error_code::operator_cast_to_bool(this_00);
            if (bVar2) {
              local_450 = 5;
            }
            else {
              local_450 = 0;
            }
            if (local_450 != 0) {
              local_430 = local_450;
              goto LAB_003e972e;
            }
          }
          if (*psVar12 == 0) {
            asio::basic_streambuf<std::allocator<char>_>::size
                      ((basic_streambuf<std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
            asio::basic_streambuf<std::allocator<char>_>::consume
                      ((basic_streambuf<std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                       CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
            *(undefined1 *)(puVar3[0x2e] + 0x14) = 1;
            local_430 = 5;
          }
          else {
            cVar13 = (const_buffer)
                     asio::basic_streambuf<std::allocator<char>_>::data
                               ((basic_streambuf<std::allocator<char>_> *)
                                CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
            *(const_buffer *)(puVar3 + 0x25) = cVar13;
            pcVar5 = asio::buffer_cast<char_const*>((const_buffer *)0x3e9451);
            *puVar11 = pcVar5;
            if (puVar3[0x11] == 0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                     (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                     CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0x27),
                         (char *)*puVar11,*psVar12);
              buf._M_str = pcVar16;
              buf._M_len = (size_t)puVar15;
              coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::async_write(this_01,buf);
              async_simple::coro::detail::LazyPromiseBase::
              await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                        ((LazyPromiseBase *)
                         CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                         (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
              bVar2 = async_simple::coro::detail::
                      LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                                ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                                 (puVar3 + 0x3c));
              if (!bVar2) {
                *(undefined1 *)((long)puVar3 + 0x204) = 3;
                handle_chunked((void *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                               ,in_stack_fffffffffffffb38);
                (*(code *)*extraout_RAX_01)(extraout_RAX_01);
                return (Lazy<std::error_code>)in_RDI._coro.__handle_.__handle_;
              }
              puVar3[0x2d] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                             (puVar3 + 0x3c);
              async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::awaitResume
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
              std::tie<std::error_code,unsigned_long>
                        ((error_code *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)
                         ,(unsigned_long *)
                          CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
              ptVar8 = std::tuple<std::error_code&,unsigned_long&>::operator=
                                 ((tuple<std::error_code_&,_unsigned_long_&> *)
                                  CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                  (pair<std::error_code,_unsigned_long> *)
                                  CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              puVar3[0x3e] = ptVar8;
              async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>
              ::ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x3e965d);
              async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                        ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x3e966a);
            }
            in_stack_fffffffffffffb58 = (char *)*psVar12;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CRCF_abi_cxx11_);
            asio::basic_streambuf<std::allocator<char>_>::consume
                      ((basic_streambuf<std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                       CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
            in_stack_fffffffffffffb54 = 0;
            local_430 = 0;
          }
        }
LAB_003e972e:
        if (local_430 != 0) {
          if (local_430 != 5) {
            local_3f8 = local_430;
            goto LAB_003e978d;
          }
          goto LAB_003e9764;
        }
        in_stack_fffffffffffffb50 = 0;
      }
      *(undefined1 *)((long)puVar3 + 0x204) = 1;
      handle_chunked((void *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     in_stack_fffffffffffffb38);
      (*(code *)*extraout_RAX)(extraout_RAX);
    }
    else {
      *(undefined1 *)((long)puVar3 + 0x204) = 0;
      handle_chunked((void *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                     (void *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    }
  }
  return (Lazy<std::error_code>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<std::error_code> handle_chunked(
      resp_data &data, req_context<String> ctx) {
    std::error_code ec{};
    size_t size = 0;
    while (true) {
      if (std::tie(ec, size) = co_await async_read_until(chunked_buf_, CRCF);
          ec) {
        break;
      }

      size_t buf_size = chunked_buf_.size();
      size_t additional_size = buf_size - size;
      const char *data_ptr =
          asio::buffer_cast<const char *>(chunked_buf_.data());
      std::string_view size_str(data_ptr, size - CRCF.size());
      auto chunk_size = hex_to_int(size_str);
      chunked_buf_.consume(size);
      if (chunk_size < 0) {
        CINATRA_LOG_DEBUG << "bad chunked size";
        ec = asio::error::make_error_code(
            asio::error::basic_errors::invalid_argument);
        break;
      }

      if (additional_size < size_t(chunk_size + 2)) {
        // not a complete chunk, read left chunk data.
        size_t size_to_read = chunk_size + 2 - additional_size;
        if (std::tie(ec, size) =
                co_await async_read(chunked_buf_, size_to_read);
            ec) {
          break;
        }
      }

      if (chunk_size == 0) {
        // all finished, no more data
        chunked_buf_.consume(chunked_buf_.size());
        data.eof = true;
        break;
      }

      data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
      if (ctx.resp_body_stream) {
        std::tie(ec, size) = co_await ctx.resp_body_stream->async_write(
            {data_ptr, (size_t)chunk_size});
      }
      else {
        resp_chunk_str_.append(data_ptr, chunk_size);
      }

      chunked_buf_.consume(chunk_size + CRCF.size());
    }
    co_return ec;
  }